

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProductEvaluators.h
# Opt level: O3

void Eigen::internal::
     generic_product_impl<Eigen::Transpose<Eigen::Matrix<float,-1,-1,0,-1,-1>const>,Eigen::Block<Eigen::Matrix<float,-1,-1,0,-1,-1>const,-1,1,true>const,Eigen::DenseShape,Eigen::DenseShape,7>
     ::scaleAndAddTo<Eigen::Block<Eigen::Matrix<float,_1,_1,0,_1,_1>,_1,1,true>>
               (Block<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,_1,_true> *dst,
               Transpose<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>_> *lhs,
               Block<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,_1,_true> *rhs,Scalar *alpha)

{
  long lVar1;
  float *pfVar2;
  char *__function;
  float fVar3;
  RhsNested actual_rhs;
  LhsNested actual_lhs;
  scalar_sum_op<float,_float> local_10d;
  Scalar local_10c;
  PointerType local_100;
  long lStack_f8;
  undefined8 local_f0;
  undefined1 local_e8 [16];
  variable_if_dynamic<long,__1> local_d8;
  XprTypeNested XStack_d0;
  variable_if_dynamic<long,__1> local_c8;
  variable_if_dynamic<long,__1> vStack_c0;
  long local_b8;
  PointerType local_b0;
  variable_if_dynamic<long,__1> local_a8;
  PointerType pfStack_98;
  variable_if_dynamic<long,__1> local_90;
  undefined8 local_88;
  XprTypeNested local_80;
  variable_if_dynamic<long,__1> local_78;
  variable_if_dynamic<long,__1> vStack_70;
  Index local_68;
  variable_if_dynamic<long,__1> local_60;
  Index local_50;
  non_const_type local_40;
  float *local_38;
  variable_if_dynamic<long,__1> local_28;
  PointerType local_20;
  variable_if_dynamic<long,__1> local_10;
  
  local_40 = lhs->m_matrix;
  if ((local_40->super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>).m_storage.m_cols
      != 1) {
    local_b8 = (rhs->
               super_BlockImpl<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,_1,_true,_Eigen::Dense>
               ).
               super_BlockImpl_dense<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,_1,_true,_true>
               .m_outerStride;
    local_e8._0_8_ =
         (rhs->
         super_BlockImpl<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,_1,_true,_Eigen::Dense>).
         super_BlockImpl_dense<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,_1,_true,_true>.
         super_MapBase<Eigen::Block<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,_1,_true>,_0>.
         m_data;
    local_e8._8_8_ =
         (rhs->
         super_BlockImpl<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,_1,_true,_Eigen::Dense>).
         super_BlockImpl_dense<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,_1,_true,_true>.
         super_MapBase<Eigen::Block<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,_1,_true>,_0>.
         m_rows.m_value;
    local_d8.m_value =
         *(long *)&(rhs->
                   super_BlockImpl<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,_1,_true,_Eigen::Dense>
                   ).
                   super_BlockImpl_dense<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,_1,_true,_true>
                   .
                   super_MapBase<Eigen::Block<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,_1,_true>,_0>
                   .field_0x10;
    XStack_d0.m_matrix =
         (rhs->
         super_BlockImpl<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,_1,_true,_Eigen::Dense>).
         super_BlockImpl_dense<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,_1,_true,_true>.
         m_xpr;
    local_c8.m_value =
         (rhs->
         super_BlockImpl<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,_1,_true,_Eigen::Dense>).
         super_BlockImpl_dense<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,_1,_true,_true>.
         m_startRow.m_value;
    vStack_c0.m_value =
         (rhs->
         super_BlockImpl<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,_1,_true,_Eigen::Dense>).
         super_BlockImpl_dense<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,_1,_true,_true>.
         m_startCol.m_value;
    gemv_dense_selector<2,1,true>::
    run<Eigen::Transpose<Eigen::Matrix<float,_1,_1,0,_1,_1>const>,Eigen::Block<Eigen::Matrix<float,_1,_1,0,_1,_1>const,_1,1,true>,Eigen::Block<Eigen::Matrix<float,_1,_1,0,_1,_1>,_1,1,true>>
              ((Transpose<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>_> *)&local_40,
               (Block<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,_1,_true> *)local_e8,dst,
               alpha);
    return;
  }
  local_e8._0_8_ =
       (local_40->super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>).m_storage.m_data;
  local_d8.m_value =
       (local_40->super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>).m_storage.m_rows;
  if (local_d8.m_value < 0 && (float *)local_e8._0_8_ != (float *)0x0) {
    __function = 
    "Eigen::MapBase<Eigen::Block<const Eigen::Transpose<const Eigen::Matrix<float, -1, -1>>, 1, -1, true>>::MapBase(PointerType, Index, Index) [Derived = Eigen::Block<const Eigen::Transpose<const Eigen::Matrix<float, -1, -1>>, 1, -1, true>, Level = 0]"
    ;
  }
  else {
    local_b0 = (rhs->
               super_BlockImpl<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,_1,_true,_Eigen::Dense>
               ).
               super_BlockImpl_dense<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,_1,_true,_true>
               .
               super_MapBase<Eigen::Block<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,_1,_true>,_0>
               .m_data;
    lVar1 = (rhs->
            super_BlockImpl<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,_1,_true,_Eigen::Dense>
            ).
            super_BlockImpl_dense<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,_1,_true,_true>.
            super_MapBase<Eigen::Block<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,_1,_true>,_0>
            .m_rows.m_value;
    if (-1 < lVar1 || local_b0 == (PointerType)0x0) {
      local_10c = *alpha;
      local_80 = (rhs->
                 super_BlockImpl<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,_1,_true,_Eigen::Dense>
                 ).
                 super_BlockImpl_dense<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,_1,_true,_true>
                 .m_xpr;
      local_f0 = *(undefined8 *)
                  &(rhs->
                   super_BlockImpl<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,_1,_true,_Eigen::Dense>
                   ).
                   super_BlockImpl_dense<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,_1,_true,_true>
                   .
                   super_MapBase<Eigen::Block<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,_1,_true>,_0>
                   .field_0x10;
      local_100 = (rhs->
                  super_BlockImpl<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,_1,_true,_Eigen::Dense>
                  ).
                  super_BlockImpl_dense<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,_1,_true,_true>
                  .
                  super_MapBase<Eigen::Block<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,_1,_true>,_0>
                  .m_data;
      lStack_f8 = (rhs->
                  super_BlockImpl<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,_1,_true,_Eigen::Dense>
                  ).
                  super_BlockImpl_dense<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,_1,_true,_true>
                  .
                  super_MapBase<Eigen::Block<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,_1,_true>,_0>
                  .m_rows.m_value;
      if (local_d8.m_value != lVar1) {
        __assert_fail("size() == other.size()",
                      "/workspace/llm4binary/github/license_c_cmakelists/patrikhuber[P]eos/3rdparty/eigen/Eigen/src/Core/Dot.h"
                      ,0x52,
                      "typename ScalarBinaryOpTraits<typename internal::traits<Derived>::Scalar, typename internal::traits<OtherDerived>::Scalar>::ReturnType Eigen::MatrixBase<Eigen::Block<const Eigen::Transpose<const Eigen::Matrix<float, -1, -1>>, 1, -1, true>>::dot(const MatrixBase<OtherDerived> &) const [Derived = Eigen::Block<const Eigen::Transpose<const Eigen::Matrix<float, -1, -1>>, 1, -1, true>, OtherDerived = Eigen::Block<const Eigen::Block<const Eigen::Matrix<float, -1, -1>, -1, 1, true>, -1, 1, true>]"
                     );
      }
      local_50 = (local_80->super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>).
                 m_storage.m_rows;
      local_c8.m_value = 0;
      vStack_c0.m_value = 0;
      local_78.m_value =
           (rhs->
           super_BlockImpl<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,_1,_true,_Eigen::Dense>
           ).super_BlockImpl_dense<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,_1,_true,_true>
           .m_startRow.m_value;
      vStack_70.m_value =
           (rhs->
           super_BlockImpl<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,_1,_true,_Eigen::Dense>
           ).super_BlockImpl_dense<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,_1,_true,_true>
           .m_startCol.m_value;
      local_68 = (rhs->
                 super_BlockImpl<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,_1,_true,_Eigen::Dense>
                 ).
                 super_BlockImpl_dense<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,_1,_true,_true>
                 .m_outerStride;
      local_60.m_value = 0;
      if (local_d8.m_value == 0) {
        fVar3 = 0.0;
      }
      else {
        XStack_d0.m_matrix = local_40;
        local_b8 = local_d8.m_value;
        local_a8.m_value = local_d8.m_value;
        pfStack_98 = local_100;
        local_90.m_value = lStack_f8;
        local_88 = local_f0;
        if (local_d8.m_value < 1) {
          __assert_fail("this->rows()>0 && this->cols()>0 && \"you are using an empty matrix\"",
                        "/workspace/llm4binary/github/license_c_cmakelists/patrikhuber[P]eos/3rdparty/eigen/Eigen/src/Core/Redux.h"
                        ,0x19b,
                        "typename internal::traits<Derived>::Scalar Eigen::DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<float>, const Eigen::Transpose<const Eigen::Block<const Eigen::Transpose<const Eigen::Matrix<float, -1, -1>>, 1, -1, true>>, const Eigen::Block<const Eigen::Block<const Eigen::Matrix<float, -1, -1>, -1, 1, true>, -1, 1, true>>>::redux(const Func &) const [Derived = Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<float>, const Eigen::Transpose<const Eigen::Block<const Eigen::Transpose<const Eigen::Matrix<float, -1, -1>>, 1, -1, true>>, const Eigen::Block<const Eigen::Block<const Eigen::Matrix<float, -1, -1>, -1, 1, true>, -1, 1, true>>, BinaryOp = Eigen::internal::scalar_sum_op<float>]"
                       );
        }
        local_38 = (float *)local_e8._0_8_;
        local_28.m_value = local_d8.m_value;
        local_20 = local_b0;
        local_10.m_value = local_50;
        fVar3 = redux_impl<Eigen::internal::scalar_sum_op<float,float>,Eigen::internal::redux_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<float,float>,Eigen::Transpose<Eigen::Block<Eigen::Transpose<Eigen::Matrix<float,-1,-1,0,-1,-1>const>const,1,-1,true>const>const,Eigen::Block<Eigen::Block<Eigen::Matrix<float,-1,-1,0,-1,-1>const,-1,1,true>const,-1,1,true>const>>,3,0>
                ::
                run<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<float,float>,Eigen::Transpose<Eigen::Block<Eigen::Transpose<Eigen::Matrix<float,_1,_1,0,_1,_1>const>const,1,_1,true>const>const,Eigen::Block<Eigen::Block<Eigen::Matrix<float,_1,_1,0,_1,_1>const,_1,1,true>const,_1,1,true>const>>
                          ((redux_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<float,_float>,_const_Eigen::Transpose<const_Eigen::Block<const_Eigen::Transpose<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>_>,_1,__1,_true>_>,_const_Eigen::Block<const_Eigen::Block<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,_1,_true>,__1,_1,_true>_>_>
                            *)&local_40,&local_10d,
                           (CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<float,_float>,_const_Eigen::Transpose<const_Eigen::Block<const_Eigen::Transpose<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>_>,_1,__1,_true>_>,_const_Eigen::Block<const_Eigen::Block<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,_1,_true>,__1,_1,_true>_>
                            *)local_e8);
      }
      pfVar2 = (dst->
               super_BlockImpl<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,_1,_true,_Eigen::Dense>).
               super_BlockImpl_dense<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,_1,_true,_true>.
               super_MapBase<Eigen::Block<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,_1,_true>,_1>.
               super_MapBase<Eigen::Block<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,_1,_true>,_0>.
               m_data;
      *pfVar2 = local_10c * fVar3 + *pfVar2;
      return;
    }
    __function = 
    "Eigen::MapBase<Eigen::Block<const Eigen::Block<const Eigen::Matrix<float, -1, -1>, -1, 1, true>, -1, 1, true>>::MapBase(PointerType, Index, Index) [Derived = Eigen::Block<const Eigen::Block<const Eigen::Matrix<float, -1, -1>, -1, 1, true>, -1, 1, true>, Level = 0]"
    ;
  }
  __assert_fail("(dataPtr == 0) || ( rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols))"
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/patrikhuber[P]eos/3rdparty/eigen/Eigen/src/Core/MapBase.h"
                ,0xb2,__function);
}

Assistant:

static EIGEN_DEVICE_FUNC EIGEN_STRONG_INLINE void scaleAndAddTo(Dest& dst, const Lhs& lhs, const Rhs& rhs, const Scalar& alpha)
  {
    // Fallback to inner product if both the lhs and rhs is a runtime vector.
    if (lhs.rows() == 1 && rhs.cols() == 1) {
      dst.coeffRef(0,0) += alpha * lhs.row(0).conjugate().dot(rhs.col(0));
      return;
    }
    LhsNested actual_lhs(lhs);
    RhsNested actual_rhs(rhs);
    internal::gemv_dense_selector<Side,
                            (int(MatrixType::Flags)&RowMajorBit) ? RowMajor : ColMajor,
                            bool(internal::blas_traits<MatrixType>::HasUsableDirectAccess)
                           >::run(actual_lhs, actual_rhs, dst, alpha);
  }